

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_result drwav_fopen(FILE **ppFile,char *pFilePath,char *pOpenMode)

{
  uint uVar1;
  FILE *pFVar2;
  int *piVar3;
  
  uVar1 = 0xfffffffe;
  if ((ppFile != (FILE **)0x0) &&
     (*ppFile = (FILE *)0x0, pOpenMode != (char *)0x0 && pFilePath != (char *)0x0)) {
    pFVar2 = fopen(pFilePath,pOpenMode);
    *ppFile = (FILE *)pFVar2;
    uVar1 = 0;
    if (pFVar2 == (FILE *)0x0) {
      piVar3 = __errno_location();
      uVar1 = drwav_result_from_errno(*piVar3);
      uVar1 = -(uint)(uVar1 == 0) | uVar1;
    }
  }
  return uVar1;
}

Assistant:

static drwav_result drwav_fopen(FILE** ppFile, const char* pFilePath, const char* pOpenMode)
{
#if _MSC_VER && _MSC_VER >= 1400
    errno_t err;
#endif

    if (ppFile != NULL) {
        *ppFile = NULL;  /* Safety. */
    }

    if (pFilePath == NULL || pOpenMode == NULL || ppFile == NULL) {
        return DRWAV_INVALID_ARGS;
    }

#if _MSC_VER && _MSC_VER >= 1400
    err = fopen_s(ppFile, pFilePath, pOpenMode);
    if (err != 0) {
        return drwav_result_from_errno(err);
    }
#else
#if defined(_WIN32) || defined(__APPLE__)
    *ppFile = fopen(pFilePath, pOpenMode);
#else
    #if defined(_FILE_OFFSET_BITS) && _FILE_OFFSET_BITS == 64 && defined(_LARGEFILE64_SOURCE)
        *ppFile = fopen64(pFilePath, pOpenMode);
    #else
        *ppFile = fopen(pFilePath, pOpenMode);
    #endif
#endif
    if (*ppFile == NULL) {
        drwav_result result = drwav_result_from_errno(errno);
        if (result == DRWAV_SUCCESS) {
            result = DRWAV_ERROR;   /* Just a safety check to make sure we never ever return success when pFile == NULL. */
        }

        return result;
    }
#endif

    return DRWAV_SUCCESS;
}